

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O3

void capnp::compiler::anon_unknown_0::initGenericParams
               (Builder builder,
               Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
               *genericParameters)

{
  size_t sVar1;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pMVar2;
  ulong uVar3;
  ulong uVar4;
  Builder params;
  StructBuilder local_a8;
  PointerBuilder local_78;
  ListBuilder local_58;
  
  if ((genericParameters->ptr).isSet == true) {
    local_a8.data = builder._builder.pointers + 7;
    local_a8.segment = builder._builder.segment;
    local_a8.capTable = builder._builder.capTable;
    capnp::_::PointerBuilder::initStructList
              (&local_58,(PointerBuilder *)&local_a8,
               *(ElementCount *)((long)&(genericParameters->ptr).field_1 + 8),(StructSize)0x10001);
    sVar1 = (genericParameters->ptr).field_1.value.value.size_;
    if (sVar1 != 0) {
      uVar4 = 0;
      do {
        uVar3 = uVar4 & 0xffffffff;
        pMVar2 = (genericParameters->ptr).field_1.value.value.ptr;
        if (pMVar2[uVar3].ptr.isSet == true) {
          capnp::_::ListBuilder::getStructElement(&local_a8,&local_58,(ElementCount)uVar4);
          local_78.segment = local_a8.segment;
          local_78.capTable = local_a8.capTable;
          local_78.pointer = local_a8.pointers;
          capnp::_::PointerBuilder::setBlob<capnp::Text>
                    (&local_78,(Reader)pMVar2[uVar3].ptr.field_1.value.value.super_StringPtr.content
                    );
          *(WirePointer *)local_a8.data = *(WirePointer *)((long)&pMVar2[uVar3].ptr.field_1 + 0x10);
        }
        uVar4 = uVar4 + 1;
      } while (sVar1 != uVar4);
    }
  }
  return;
}

Assistant:

static void initGenericParams(Declaration::Builder builder,
    kj::Maybe<Located<kj::Array<kj::Maybe<Located<Text::Reader>>>>>&& genericParameters) {
  KJ_IF_SOME(p, genericParameters) {
    auto params = builder.initParameters(p.value.size());
    for (uint i: kj::indices(p.value)) {
      KJ_IF_SOME(name, p.value[i]) {
        auto param = params[i];
        param.setName(name.value);
        name.copyLocationTo(param);
      }
    }
  }
}